

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

string * __thiscall
json::Integer::stringify_abi_cxx11_(string *__return_storage_ptr__,Integer *this)

{
  stringstream local_1a0 [8];
  stringstream stream;
  undefined1 local_190 [376];
  Integer *local_18;
  Integer *this_local;
  
  local_18 = this;
  this_local = (Integer *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::ostream::operator<<(local_190,this->value);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string stringify() const {
            std::stringstream stream;
            stream << value;
            return stream.str();
        }